

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,string_t *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t y_data;
  string_t x_data;
  bool bVar1;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  undefined8 *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffa8;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffcf;
  string_t *in_stack_ffffffffffffffd0;
  string_t *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffb8,(idx_t)in_stack_ffffffffffffffb0);
    if (bVar1) {
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
      Assign<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
                (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 (bool)in_stack_ffffffffffffffcf);
      *in_RDI = 1;
    }
  }
  else {
    x_data.value.pointer.ptr = (char *)*in_RSI;
    x_data.value._0_8_ =
         (in_RDX->validity_data).internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    y_data.value.pointer.ptr = (char *)in_RDX->validity_mask;
    y_data.value._0_8_ = in_stack_ffffffffffffffb8;
    Execute<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
              (in_stack_ffffffffffffffb0,x_data,y_data,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}